

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAML.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
jaegertracing::utils::yaml::findOrDefault<std::__cxx11::string,char[5],char[1]>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,yaml *this,Node *node,char (*key) [5],char (*defaultValue) [1])

{
  size_t sVar1;
  Node valueNode;
  Node local_40;
  as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_20;
  
  YAML::Node::operator[]<char[5]>(&local_40,(Node *)this,&node->m_isValid);
  if ((local_40.m_isValid == true) &&
     ((local_40.m_pNode == (node *)0x0 || (*(char *)**(undefined8 **)local_40.m_pNode != '\0')))) {
    local_20.node = &local_40;
    YAML::
    as_if<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    operator()(__return_storage_ptr__,&local_20);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(*key);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,key,*key + sVar1);
  }
  if (local_40.m_pMemory.super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

ValueType findOrDefault(const YAML::Node& node,
                        const KeyType& key,
                        const DefaultValueType& defaultValue)
{
    const auto valueNode = node[key];
    if (!valueNode.IsDefined()) {
        return defaultValue;
    }
    return valueNode.template as<ValueType>();
}